

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_transaction.cpp
# Opt level: O0

void __thiscall cpp_db::sqlite_transaction::execute(sqlite_transaction *this,char *sql)

{
  char *pcVar1;
  int iVar2;
  sqlite3 *psVar3;
  size_t sVar4;
  sqlite_exception *psVar5;
  unique_ptr<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  local_48;
  unique_ptr<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  pstmt;
  anon_class_1_0_00000001_for__M_head_impl deleter;
  pointer psStack_28;
  int status;
  sqlite3_stmt *stmt;
  char *tail;
  char *sql_local;
  sqlite_transaction *this_local;
  
  stmt = (sqlite3_stmt *)0x0;
  psStack_28 = (pointer)0x0;
  tail = sql;
  sql_local = (char *)this;
  psVar3 = get_db_handle(this);
  pcVar1 = tail;
  sVar4 = strlen(tail);
  iVar2 = sqlite3_prepare(psVar3,pcVar1,sVar4 & 0xffffffff,&stack0xffffffffffffffd8,&stmt);
  if ((iVar2 != 0) && (iVar2 != 0x65)) {
    psVar5 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    psVar3 = get_db_handle(this);
    sqlite_exception::sqlite_exception(psVar5,iVar2,psVar3);
    __cxa_throw(psVar5,&sqlite_exception::typeinfo,sqlite_exception::~sqlite_exception);
  }
  pstmt._M_t.
  super___uniq_ptr_impl<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  ._M_t.
  super__Tuple_impl<0UL,_sqlite3_stmt_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
  .super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl._3_1_ = 0;
  std::unique_ptr<sqlite3_stmt,cpp_db::sqlite_transaction::execute(char_const*)::$_0>::
  unique_ptr<cpp_db::sqlite_transaction::execute(char_const*)::__0,void>
            ((unique_ptr<sqlite3_stmt,cpp_db::sqlite_transaction::execute(char_const*)::__0> *)
             &local_48,psStack_28,
             (deleter_type *)
             ((long)&pstmt._M_t.
                     super___uniq_ptr_impl<sqlite3_stmt,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
                     ._M_t.
                     super__Tuple_impl<0UL,_sqlite3_stmt_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_transaction_cpp:43:20)>
                     .super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl + 3));
  iVar2 = sqlite3_step(psStack_28);
  if ((iVar2 != 0) && (iVar2 != 0x65)) {
    psVar5 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    psVar3 = get_db_handle(this);
    sqlite_exception::sqlite_exception(psVar5,iVar2,psVar3);
    __cxa_throw(psVar5,&sqlite_exception::typeinfo,sqlite_exception::~sqlite_exception);
  }
  std::
  unique_ptr<sqlite3_stmt,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/sqlite/sqlite_transaction.cpp:43:20)>
  ::~unique_ptr(&local_48);
  return;
}

Assistant:

void sqlite_transaction::execute(const char *sql)
{
    const char *tail = nullptr;
    sqlite3_stmt *stmt = nullptr;
	int status = sqlite3_prepare(get_db_handle(), sql, static_cast<int>(strlen(sql)), &stmt, &tail);
    if (status != SQLITE_OK && status != SQLITE_DONE)
        throw sqlite_exception(status, get_db_handle());
    auto deleter = [](sqlite3_stmt*s){sqlite3_finalize(s); };
    std::unique_ptr<sqlite3_stmt, decltype(deleter)> pstmt(stmt, deleter);
    status = sqlite3_step(stmt);
    if (status != SQLITE_OK && status != SQLITE_DONE)
        throw sqlite_exception(status, get_db_handle());
}